

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O0

int big_file_mpi_read_records
              (BigFile *bf,BigRecordType *rtype,ptrdiff_t offset,size_t size,void *buf,
              int concurrency,MPI_Comm comm)

{
  int iVar1;
  undefined1 local_2d0 [8];
  BigBlockPtr ptr;
  BigBlock block [1];
  BigArray array [1];
  int local_40;
  int i;
  int concurrency_local;
  void *buf_local;
  size_t size_local;
  ptrdiff_t offset_local;
  BigRecordType *rtype_local;
  BigFile *bf_local;
  
  local_40 = 0;
  while( true ) {
    if (rtype->nfield <= (ulong)(long)local_40) {
      return 0;
    }
    memset(local_2d0,0,0x18);
    iVar1 = big_record_view_field(rtype,local_40,(BigArray *)&block[0].dirty,size,buf);
    if (iVar1 != 0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                      ,0x2a5);
      return -1;
    }
    iVar1 = big_file_mpi_open_block(bf,(BigBlock *)&ptr.aoffset,rtype->fields[local_40].name,comm);
    if (iVar1 != 0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                      ,0x2a8);
      return -1;
    }
    iVar1 = big_block_seek((BigBlock *)&ptr.aoffset,(BigBlockPtr *)local_2d0,offset);
    if (iVar1 != 0) break;
    iVar1 = big_block_mpi_read((BigBlock *)&ptr.aoffset,(BigBlockPtr *)local_2d0,
                               (BigArray *)&block[0].dirty,concurrency,comm);
    if (iVar1 != 0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                      ,0x2ae);
      goto LAB_00105d7e;
    }
    iVar1 = big_block_mpi_close((BigBlock *)&ptr.aoffset,comm);
    if (iVar1 != 0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                      ,0x2b1);
      return -1;
    }
    local_40 = local_40 + 1;
  }
  _big_file_raise((char *)0x0,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                  ,0x2ab);
LAB_00105d7e:
  iVar1 = big_block_mpi_close((BigBlock *)&ptr.aoffset,comm);
  if (iVar1 != 0) {
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                    ,0x2b7);
    return -1;
  }
  return -1;
}

Assistant:

int
big_file_mpi_read_records(BigFile * bf,
    const BigRecordType * rtype,
    ptrdiff_t offset,
    size_t size,
    void * buf,
    int concurrency,
    MPI_Comm comm)
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        BigArray array[1];
        BigBlock block[1];
        BigBlockPtr ptr = {0};

        RAISEIF(0 != big_record_view_field(rtype, i, array, size, buf),
            ex_array,
            NULL);
        RAISEIF(0 != big_file_mpi_open_block(bf, block, rtype->fields[i].name, comm),
            ex_open,
            NULL);
        RAISEIF(0 != big_block_seek(block, &ptr, offset),
            ex_seek,
            NULL);
        RAISEIF(0 != big_block_mpi_read(block, &ptr, array, concurrency, comm),
            ex_read,
            NULL);
        RAISEIF(0 != big_block_mpi_close(block, comm),
            ex_close,
            NULL);
        continue;
        ex_read:
        ex_seek:
            RAISEIF(0 != big_block_mpi_close(block, comm),
            ex_close,
            NULL);
            return -1;
        ex_open:
        ex_close:
        ex_array:
            return -1;
    }
    return 0;
}